

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,ExprList *pCNames,
                      Select *pSelect,int isTemp,int noErr)

{
  byte *pbVar1;
  sqlite3 *db;
  Table *pTVar2;
  Schema *pSVar3;
  Db *pDVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  Select *pSVar8;
  ExprList *pEVar9;
  long lVar10;
  Schema **ppSVar11;
  RenameToken *pRVar12;
  DbFixer sFix;
  Token *local_b0;
  Token local_a8;
  Token *local_98;
  DbFixer local_90;
  Walker local_60;
  
  local_b0 = (Token *)0x0;
  db = pParse->db;
  if (pParse->nVar < 1) {
    local_98 = pBegin;
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTVar2 = pParse->pNewTable;
    if ((pTVar2 != (Table *)0x0) && (pParse->nErr == 0)) {
      sqlite3TwoPartName(pParse,pName1,pName2,&local_b0);
      if (pTVar2->pSchema == (Schema *)0x0) {
        iVar7 = -1000000;
      }
      else {
        iVar7 = -1;
        ppSVar11 = &db->aDb->pSchema;
        do {
          iVar7 = iVar7 + 1;
          pSVar3 = *ppSVar11;
          ppSVar11 = ppSVar11 + 4;
        } while (pSVar3 != pTVar2->pSchema);
      }
      pDVar4 = pParse->db->aDb;
      local_90.zDb = pDVar4[iVar7].zDbSName;
      local_90.pSchema = pDVar4[iVar7].pSchema;
      local_90.zType = "view";
      local_90.pName = local_b0;
      local_90.bVarOnly = (int)(iVar7 == 1);
      local_90.pParse = pParse;
      iVar7 = sqlite3FixSelect(&local_90,pSelect);
      if (iVar7 == 0) {
        if (pParse->eParseMode < 2) {
          pSVar8 = sqlite3SelectDup(db,pSelect,1);
        }
        else {
          pSVar8 = pSelect;
          pSelect = (Select *)0x0;
        }
        pTVar2->pSelect = pSVar8;
        pEVar9 = sqlite3ExprListDup(db,pCNames,1);
        pTVar2->pCheck = pEVar9;
        if (db->mallocFailed == '\0') {
          pcVar5 = (pParse->sLastToken).z;
          uVar6 = *(undefined8 *)&(pParse->sLastToken).n;
          local_a8.n = 0;
          if (*pcVar5 != ';') {
            local_a8.n = (uint)uVar6;
          }
          local_a8.z = local_98->z + (int)(((int)pcVar5 + local_a8.n) - (int)local_98->z);
          do {
            pbVar1 = (byte *)(local_a8.z + -1);
            local_a8.z = local_a8.z + -1;
          } while ((""[*pbVar1] & 1) != 0);
          local_a8._12_4_ = SUB84((ulong)uVar6 >> 0x20,0);
          local_a8.n = 1;
          sqlite3EndTable(pParse,(Token *)0x0,&local_a8,'\0',(Select *)0x0);
        }
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  if (1 < pParse->eParseMode) {
    if (pCNames == (ExprList *)0x0) {
      return;
    }
    local_60.walkerDepth = 0;
    local_60.eCode = '\0';
    local_60._37_3_ = 0;
    local_60.u.pNC = (NameContext *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_60.xExprCallback = renameUnmapExprCb;
    local_60.pParse = pParse;
    sqlite3WalkExprList(&local_60,pCNames);
    iVar7 = pCNames->nExpr;
    if (0 < (long)iVar7) {
      lVar10 = 0;
      do {
        pRVar12 = pParse->pRename;
        if (pRVar12 != (RenameToken *)0x0) {
          do {
            if ((char *)pRVar12->p == pCNames->a[lVar10].zName) {
              pRVar12->p = (void *)0x0;
              break;
            }
            pRVar12 = pRVar12->pNext;
          } while (pRVar12 != (RenameToken *)0x0);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar7);
    }
  }
  if (pCNames != (ExprList *)0x0) {
    exprListDeleteNN(db,pCNames);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  ExprList *pCNames, /* Optional list of view column names */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    goto create_view_fail;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ) goto create_view_fail;
  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ) goto create_view_fail;

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  if( IN_RENAME_OBJECT ){
    p->pSelect = pSelect;
    pSelect = 0;
  }else{
    p->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  }
  p->pCheck = sqlite3ExprListDup(db, pCNames, EXPRDUP_REDUCE);
  if( db->mallocFailed ) goto create_view_fail;

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  assert( sEnd.z[0]!=0 || sEnd.n==0 );
  if( sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  assert( n>0 );
  z = pBegin->z;
  while( sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the SQLITE_MASTER table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);

create_view_fail:
  sqlite3SelectDelete(db, pSelect);
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprlistUnmap(pParse, pCNames);
  }
  sqlite3ExprListDelete(db, pCNames);
  return;
}